

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O0

bool IsFinalTx(CTransaction *tx,int nBlockHeight,int64_t nBlockTime)

{
  long lVar1;
  bool bVar2;
  reference pCVar3;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x34) == 0) {
    local_19 = true;
  }
  else {
    if (*(uint *)(in_RDI + 0x34) < 500000000) {
      in_RDX = (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               (long)in_ESI;
    }
    if ((long)(ulong)*(uint *)(in_RDI + 0x34) < (long)in_RDX) {
      local_19 = true;
    }
    else {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      while (bVar2 = __gnu_cxx::
                     operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               (in_RDX,(__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                        *)CONCAT17(in_stack_ffffffffffffffa7,
                                                   in_stack_ffffffffffffffa0)),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        pCVar3 = __gnu_cxx::
                 __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
                 operator*(in_stack_ffffffffffffff98);
        if (pCVar3->nSequence != 0xffffffff) {
          local_19 = false;
          goto LAB_008cb135;
        }
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator++(in_stack_ffffffffffffff98);
      }
      local_19 = true;
    }
  }
LAB_008cb135:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool IsFinalTx(const CTransaction &tx, int nBlockHeight, int64_t nBlockTime)
{
    if (tx.nLockTime == 0)
        return true;
    if ((int64_t)tx.nLockTime < ((int64_t)tx.nLockTime < LOCKTIME_THRESHOLD ? (int64_t)nBlockHeight : nBlockTime))
        return true;

    // Even if tx.nLockTime isn't satisfied by nBlockHeight/nBlockTime, a
    // transaction is still considered final if all inputs' nSequence ==
    // SEQUENCE_FINAL (0xffffffff), in which case nLockTime is ignored.
    //
    // Because of this behavior OP_CHECKLOCKTIMEVERIFY/CheckLockTime() will
    // also check that the spending input's nSequence != SEQUENCE_FINAL,
    // ensuring that an unsatisfied nLockTime value will actually cause
    // IsFinalTx() to return false here:
    for (const auto& txin : tx.vin) {
        if (!(txin.nSequence == CTxIn::SEQUENCE_FINAL))
            return false;
    }
    return true;
}